

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_dump_waiting_children(lws *wsi)

{
  undefined4 uVar1;
  char *pcVar2;
  lws_log_cx *cx;
  char *local_50;
  lws *local_20;
  lws *wsi_local;
  
  pcVar2 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: children waiting for POLLOUT service:\n","lws_wsi_mux_dump_waiting_children",
           pcVar2);
  for (local_20 = (wsi->mux).child_list; local_20 != (lws *)0x0;
      local_20 = (local_20->mux).sibling_list) {
    cx = lwsl_wsi_get_cx(local_20);
    uVar1 = 0x20;
    if ((local_20->mux).requested_POLLOUT != '\0') {
      uVar1 = 0x2a;
    }
    if ((local_20->a).protocol == (lws_protocols *)0x0) {
      local_50 = "noprotocol";
    }
    else {
      local_50 = ((local_20->a).protocol)->name;
    }
    _lws_log_cx(cx,lws_log_prepend_wsi,local_20,8,"lws_wsi_mux_dump_waiting_children",
                "  %c sid %u: 0x%x %s %s",uVar1,(local_20->mux).my_sid,local_20->wsistate & 0xffff,
                local_20->role_ops->name,local_50);
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_waiting_children(struct lws *wsi)
{
#if defined(_DEBUG)
	lwsl_info("%s: %s: children waiting for POLLOUT service:\n",
		  __func__, lws_wsi_tag(wsi));

	wsi = wsi->mux.child_list;
	while (wsi) {
		lwsl_wsi_info(wsi, "  %c sid %u: 0x%x %s %s",
			  wsi->mux.requested_POLLOUT ? '*' : ' ',
			  wsi->mux.my_sid, lwsi_state(wsi),
			  wsi->role_ops->name,
			  wsi->a.protocol ? wsi->a.protocol->name : "noprotocol");

		wsi = wsi->mux.sibling_list;
	}
#endif
}